

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_tuple_uncheckedSlotAt(sysbvm_context_t *context,sysbvm_tuple_t tuple,size_t slotIndex)

{
  if ((tuple & 0xf) == 0 && tuple != 0) {
    if ((*(uint *)(tuple + 8) & 0x300) == 0x200) {
      sysbvm_error("uncheckedSlotAt used with byte tuple.");
    }
    if (slotIndex < *(uint *)(tuple + 0xc) >> 3) goto LAB_00143535;
  }
  else {
    sysbvm_error_modifyImmediateValue();
  }
  sysbvm_error_outOfBoundsSlotAccess();
LAB_00143535:
  return *(sysbvm_tuple_t *)(tuple + 0x10 + slotIndex * 8);
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_tuple_uncheckedSlotAt(sysbvm_context_t *context, sysbvm_tuple_t tuple, size_t slotIndex)
{
    (void)context;
    if(!sysbvm_tuple_isNonNullPointer(tuple)) sysbvm_error_modifyImmediateValue();
    if(sysbvm_tuple_isBytes(tuple)) sysbvm_error("uncheckedSlotAt used with byte tuple.");
    if(slotIndex >= sysbvm_tuple_getSizeInSlots(tuple)) sysbvm_error_outOfBoundsSlotAccess();
    
    return SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(tuple)->pointers[slotIndex];
}